

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

void __thiscall CVmObjFile::check_raw_read(CVmObjFile *this)

{
  check_valid_file(this);
  check_read_access(this);
  check_raw_mode(this);
  return;
}

Assistant:

void CVmObjFile::check_raw_read(VMG0_)
{
    check_valid_file(vmg0_);
    check_read_access(vmg0_);
    check_raw_mode(vmg0_);
}